

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

pool_ptr<soul::heart::Variable> __thiscall
soul::heart::Parser::findVariable(Parser *this,FunctionParseState *state,string *name)

{
  long *plVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  Module *pMVar6;
  _func_int **pp_Var7;
  string *in_RCX;
  long lVar8;
  long *plVar9;
  string_view other;
  string_view other_00;
  string_view name_00;
  string_view other_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  string variableName;
  string local_108;
  TokenisedPathString path;
  
  bVar5 = containsChar(in_RCX,':');
  if (bVar5) {
    if (*(in_RCX->_M_dataplus)._M_p != '$') {
      throwInternalCompilerError("name[0] == \'$\'","findVariable",0x461);
    }
    std::__cxx11::string::substr((ulong)&local_108,(ulong)in_RCX);
    TokenisedPathString::TokenisedPathString(&path,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    TokenisedPathString::getLastPart_abi_cxx11_(&variableName,&path);
    TokenisedPathString::getParentPath_abi_cxx11_(&local_168,&path);
    std::operator+(&local_188,"$",&variableName);
    TokenisedPathString::join(&local_148,&local_168,&local_188);
    Program::findVariableWithName((Program *)this,(string *)&state[1].currentBlock);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&variableName);
    TokenisedPathString::~TokenisedPathString(&path);
  }
  else {
    plVar1 = (long *)name[1]._M_string_length;
    for (plVar9 = (long *)name[1]._M_dataplus._M_p; plVar9 != plVar1; plVar9 = plVar9 + 1) {
      other._M_str = (in_RCX->_M_dataplus)._M_p;
      other._M_len = in_RCX->_M_string_length;
      bVar5 = Identifier::operator==((Identifier *)(*plVar9 + 0x30),other);
      if (bVar5) {
        pp_Var7 = (_func_int **)*plVar9;
        goto LAB_00251991;
      }
    }
    pcVar2 = (name->_M_dataplus)._M_p;
    lVar3 = *(long *)(pcVar2 + 0x38);
    lVar4 = *(long *)(pcVar2 + 0x40);
    for (lVar8 = 0; lVar4 << 3 != lVar8; lVar8 = lVar8 + 8) {
      other_00._M_str = (in_RCX->_M_dataplus)._M_p;
      other_00._M_len = in_RCX->_M_string_length;
      bVar5 = Identifier::operator==((Identifier *)(*(long *)(lVar3 + lVar8) + 0x30),other_00);
      if (bVar5) {
        pp_Var7 = *(_func_int ***)(lVar3 + lVar8);
        goto LAB_00251991;
      }
    }
    pMVar6 = pool_ptr<soul::Module>::operator->((pool_ptr<soul::Module> *)&state[2].blocks);
    name_00._M_str = (char *)in_RCX->_M_string_length;
    name_00._M_len = (size_t)&pMVar6->stateVariables;
    Module::StateVariables::find((StateVariables *)this,name_00);
    if ((this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser == (_func_int **)0x0) {
      plVar9 = *(long **)((long)&name[1].field_2 + 8);
      if (plVar9 != (long *)0x0) {
        lVar3 = *plVar9;
        plVar1 = *(long **)(lVar3 + 0x28);
        for (plVar9 = *(long **)(lVar3 + 0x20); plVar9 != plVar1; plVar9 = plVar9 + 1) {
          other_01._M_str = (in_RCX->_M_dataplus)._M_p;
          other_01._M_len = in_RCX->_M_string_length;
          bVar5 = Identifier::operator==((Identifier *)(*plVar9 + 0x30),other_01);
          if (bVar5) {
            pp_Var7 = (_func_int **)*plVar9;
LAB_00251991:
            (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser = pp_Var7;
            return (pool_ptr<soul::heart::Variable>)(Variable *)this;
          }
        }
      }
      Program::findVariableWithName((Program *)this,(string *)&state[1].currentBlock);
    }
  }
  return (pool_ptr<soul::heart::Variable>)(Variable *)this;
}

Assistant:

pool_ptr<heart::Variable> findVariable (const FunctionParseState& state, const std::string& name)
    {
        if (containsChar (name, ':'))
        {
            SOUL_ASSERT (name[0] == '$');
            TokenisedPathString path (name.substr (1));
            auto variableName = path.getLastPart();
            return program.findVariableWithName (TokenisedPathString::join (path.getParentPath(), "$" + variableName));
        }

        for (auto& v : state.variables)
            if (v->name == name)
                return v;

        for (auto& parameter : state.function.parameters)
            if (parameter->name == name)
                return parameter;

        if (auto stateVariable = module->stateVariables.find (name))
            return stateVariable;

        if (state.currentBlock != nullptr)
        {
            for (auto& blockParameter : state.currentBlock->block.parameters)
                if (blockParameter->name == name)
                    return blockParameter;
        }

        return program.findVariableWithName (name);
    }